

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_ElementsSourceDataConstructorTest_Test::~Address_ElementsSourceDataConstructorTest_Test
          (Address_ElementsSourceDataConstructorTest_Test *this)

{
  Address_ElementsSourceDataConstructorTest_Test *this_local;
  
  ~Address_ElementsSourceDataConstructorTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Address, ElementsSourceDataConstructorTest) {
  Address addr;
  for (ElementsUnblindedAddressTestVector test : test_vectors) {
    // pubkey/script constructor
    {
      ByteData hash;
      if ((test.addr_type == AddressType::kP2wpkhAddress)
          || (test.addr_type == AddressType::kP2wshAddress)) {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type,
              WitnessVersion::kVersion0, test.pubkey,
              GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type,
              WitnessVersion::kVersion0, test.script,
              GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Sha256(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
      } else {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type, test.pubkey, GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type, test.script, GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
      }

      EXPECT_FALSE(ElementsConfidentialAddress::IsConfidentialAddress(test.address, GetElementsAddressFormatList()));
      EXPECT_STREQ(test.address.c_str(), addr.GetAddress().c_str());
      switch (test.addr_type) {
        case AddressType::kP2shP2wshAddress:
        case AddressType::kP2shP2wpkhAddress:
          EXPECT_EQ(AddressType::kP2shAddress, addr.GetAddressType());
          break;
        default:
          EXPECT_EQ(test.addr_type, addr.GetAddressType());
          break;
      }
      EXPECT_EQ(test.net_type, addr.GetNetType());
      EXPECT_STREQ(hash.GetHex().c_str(), addr.GetHash().GetHex().c_str());
    }
  }
}